

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraphFlattener::convertLightsAndCameras
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  undefined8 uVar7;
  BBox1f time_range;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  bool bVar9;
  Node *pNVar10;
  size_t sVar11;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar12;
  long lVar13;
  Ref<embree::SceneGraph::Node> *pRVar14;
  size_type sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  ulong uVar38;
  pointer pRVar39;
  pointer pRVar40;
  byte bVar41;
  undefined4 uVar42;
  long *plVar43;
  ulong uVar44;
  ostream *poVar45;
  void *pvVar46;
  ulong uVar47;
  AnimatedPerspectiveCameraNode *pAVar48;
  AnimatedLightNode *this_00;
  PerspectiveCameraNode *pPVar49;
  PerspectiveCameraNode *this_01;
  runtime_error *prVar50;
  byte bVar52;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  long lVar53;
  size_t i;
  ulong uVar54;
  Ref<embree::SceneGraph::Node> *node_00;
  ulong uVar55;
  size_t i_3;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  float local_218;
  float local_208;
  float fStack_204;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f8;
  size_t local_1e8;
  size_t sStack_1e0;
  void *local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cameraNode_1;
  allocator local_189;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> cameraNode;
  float local_138;
  float fStack_134;
  float fStack_130;
  string local_90;
  string local_70;
  string local_50;
  undefined7 uVar51;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  
  pNVar10 = node->ptr;
  if (pNVar10->hasLightOrCamera == true) {
    plVar43 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
    if (plVar43 == (long *)0x0) {
      plVar43 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::GroupNode::typeinfo,0);
      if (plVar43 == (long *)0x0) {
        plVar43 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::AnimatedLightNode::typeinfo,0);
        if (plVar43 == (long *)0x0) {
          plVar43 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::LightNode::typeinfo,0);
          if (plVar43 == (long *)0x0) {
            cameraNode.ptr =
                 (AnimatedPerspectiveCameraNode *)
                 __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0);
            if (cameraNode.ptr == (AnimatedPerspectiveCameraNode *)0x0) {
              cameraNode_1.ptr =
                   (PerspectiveCameraNode *)
                   __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                  &SceneGraph::PerspectiveCameraNode::typeinfo,0);
              if (cameraNode_1.ptr != (PerspectiveCameraNode *)0x0) {
                (*((cameraNode_1.ptr)->super_Node).super_RefCount._vptr_RefCount[2])
                          (cameraNode_1.ptr);
                if (cameraNode_1.ptr != (PerspectiveCameraNode *)0x0) {
                  sVar15 = (spaces->spaces).size_active;
                  if (sVar15 == 1) {
                    pPVar49 = (PerspectiveCameraNode *)
                              SceneGraph::PerspectiveCameraNode::operator_new(0xb0);
                    pAVar12 = (spaces->spaces).items;
                    local_1f8._0_8_ = *(undefined8 *)&(pAVar12->l).vx.field_0;
                    local_1f8._8_8_ = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + 8);
                    local_1e8 = *(size_t *)&(pAVar12->l).vy.field_0;
                    sStack_1e0 = *(undefined8 *)((long)&(pAVar12->l).vy.field_0 + 8);
                    local_1d8 = *(void **)&(pAVar12->l).vz.field_0;
                    uStack_1d0 = *(ulong *)((long)&(pAVar12->l).vz.field_0 + 8);
                    local_1c8 = *(undefined8 *)&(pAVar12->p).field_0;
                    uStack_1c0 = *(undefined8 *)((long)&(pAVar12->p).field_0 + 8);
                    std::__cxx11::string::string
                              ((string *)&local_70,(string *)&((cameraNode_1.ptr)->super_Node).name)
                    ;
                    makeUniqueID((string *)&lights,this,&local_70);
                    SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                              (pPVar49,&cameraNode_1,(AffineSpace3fa *)&local_1f8.field_1,
                               (string *)&lights);
                    cameras.
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)pPVar49;
                    (*(pPVar49->super_Node).super_RefCount._vptr_RefCount[2])(pPVar49);
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                              ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                *)group,(Ref<embree::SceneGraph::Node> *)&cameras);
                    if (cameras.
                        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      (*(code *)((cameras.
                                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).
                                fileName._M_string_length)();
                    }
                    std::__cxx11::string::~string((string *)&lights);
                    std::__cxx11::string::~string((string *)&local_70);
                  }
                  else {
                    std::
                    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ::vector(&cameras,sVar15,(allocator_type *)&local_1f8.field_1);
                    lVar53 = 0x30;
                    for (uVar54 = 0; uVar54 < (spaces->spaces).size_active; uVar54 = uVar54 + 1) {
                      this_01 = (PerspectiveCameraNode *)
                                SceneGraph::PerspectiveCameraNode::operator_new(0xb0);
                      pAVar12 = (spaces->spaces).items;
                      puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x30);
                      local_1f8._0_8_ = *puVar5;
                      local_1f8._8_8_ = puVar5[1];
                      puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x20);
                      local_1e8 = *puVar5;
                      sStack_1e0 = puVar5[1];
                      puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x10);
                      local_1d8 = (void *)*puVar5;
                      uStack_1d0 = puVar5[1];
                      puVar5 = (undefined8 *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                      local_1c8 = *puVar5;
                      uStack_1c0 = puVar5[1];
                      std::__cxx11::string::string((string *)&lights,"",&local_189);
                      SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                                (this_01,&cameraNode_1,(AffineSpace3fa *)&local_1f8.field_1,
                                 (string *)&lights);
                      pRVar39 = cameras.
                                super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
                      pPVar49 = pRVar39[uVar54].ptr;
                      if (pPVar49 != (PerspectiveCameraNode *)0x0) {
                        (*(pPVar49->super_Node).super_RefCount._vptr_RefCount[3])();
                      }
                      pRVar39[uVar54].ptr = this_01;
                      std::__cxx11::string::~string((string *)&lights);
                      lVar53 = lVar53 + 0x40;
                    }
                    pAVar48 = (AnimatedPerspectiveCameraNode *)
                              SceneGraph::PerspectiveCameraNode::operator_new(0xd0);
                    time_range = spaces->time_range;
                    std::__cxx11::string::string
                              ((string *)&local_90,(string *)&((cameraNode_1.ptr)->super_Node).name)
                    ;
                    makeUniqueID((string *)&local_1f8.field_1,this,&local_90);
                    SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                              (pAVar48,&cameras,time_range,(string *)&local_1f8.field_1);
                    lights.
                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar48;
                    (*(pAVar48->super_PerspectiveCameraNode).super_Node.super_RefCount.
                      _vptr_RefCount[2])(pAVar48);
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                              ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                *)group,(Ref<embree::SceneGraph::Node> *)&lights);
                    if (lights.
                        super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      (*(code *)((lights.
                                  super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).
                                fileName._M_string_length)();
                    }
                    std::__cxx11::string::~string((string *)&local_1f8.field_1);
                    std::__cxx11::string::~string((string *)&local_90);
                    std::
                    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ::~vector(&cameras);
                  }
                  if (cameraNode_1.ptr != (PerspectiveCameraNode *)0x0) {
                    (*((cameraNode_1.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                  }
                }
              }
            }
            else {
              (*((cameraNode.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                _vptr_RefCount[2])(cameraNode.ptr);
              if ((spaces->spaces).size_active != 1) {
                prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar50,
                           "animated cameras cannot get instantiated with a transform animation");
                __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pAVar48 = (AnimatedPerspectiveCameraNode *)
                        SceneGraph::PerspectiveCameraNode::operator_new(0xd0);
              pAVar12 = (spaces->spaces).items;
              local_1f8._0_8_ = *(undefined8 *)&(pAVar12->l).vx.field_0;
              local_1f8._8_8_ = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + 8);
              local_1e8 = *(size_t *)&(pAVar12->l).vy.field_0;
              sStack_1e0 = *(undefined8 *)((long)&(pAVar12->l).vy.field_0 + 8);
              local_1d8 = *(void **)&(pAVar12->l).vz.field_0;
              uStack_1d0 = *(ulong *)((long)&(pAVar12->l).vz.field_0 + 8);
              local_1c8 = *(undefined8 *)&(pAVar12->p).field_0;
              uStack_1c0 = *(undefined8 *)((long)&(pAVar12->p).field_0 + 8);
              std::__cxx11::string::string
                        ((string *)&local_50,
                         (string *)&((cameraNode.ptr)->super_PerspectiveCameraNode).super_Node.name)
              ;
              makeUniqueID((string *)&lights,this,&local_50);
              SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                        (pAVar48,&cameraNode,(AffineSpace3fa *)&local_1f8.field_1,(string *)&lights)
              ;
              cameras.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar48;
              (*(pAVar48->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])
                        (pAVar48);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)group,(Ref<embree::SceneGraph::Node> *)&cameras);
              if (cameras.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (*(code *)((cameras.
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                          _M_string_length)();
              }
              std::__cxx11::string::~string((string *)&lights);
              std::__cxx11::string::~string((string *)&local_50);
            }
            if (cameraNode.ptr != (AnimatedPerspectiveCameraNode *)0x0) {
              (*((cameraNode.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                _vptr_RefCount[3])();
            }
          }
          else {
            (**(code **)(*plVar43 + 0x10))(plVar43);
            sVar15 = (spaces->spaces).size_active;
            if (sVar15 == 1) {
              pAVar12 = (spaces->spaces).items;
              local_1f8._0_8_ = *(undefined8 *)&(pAVar12->l).vx.field_0;
              local_1f8._8_8_ = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + 8);
              local_1e8 = *(size_t *)&(pAVar12->l).vy.field_0;
              sStack_1e0 = *(undefined8 *)((long)&(pAVar12->l).vy.field_0 + 8);
              local_1d8 = *(void **)&(pAVar12->l).vz.field_0;
              uStack_1d0 = *(ulong *)((long)&(pAVar12->l).vz.field_0 + 8);
              local_1c8 = *(undefined8 *)&(pAVar12->p).field_0;
              uStack_1c0 = *(undefined8 *)((long)&(pAVar12->p).field_0 + 8);
              (**(code **)(*plVar43 + 0x80))(&cameras,plVar43);
              lights.
              super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)cameras.
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if (cameras.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (*(code *)((cameras.
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                          _M_dataplus._M_p)();
              }
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)group,(Ref<embree::SceneGraph::Node> *)&lights);
              if (lights.
                  super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (*(code *)((lights.
                            super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                          _M_string_length)();
              }
              if (cameras.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (*(code *)((cameras.
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                          _M_string_length)();
              }
            }
            else {
              std::
              vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ::vector(&lights,sVar15,(allocator_type *)&local_1f8.field_1);
              lVar53 = 0x30;
              for (uVar54 = 0; uVar54 < (spaces->spaces).size_active; uVar54 = uVar54 + 1) {
                pAVar12 = (spaces->spaces).items;
                puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x30);
                local_1f8._0_8_ = *puVar5;
                local_1f8._8_8_ = puVar5[1];
                puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x20);
                local_1e8 = *puVar5;
                sStack_1e0 = puVar5[1];
                puVar5 = (undefined8 *)((long)pAVar12 + lVar53 + -0x10);
                local_1d8 = (void *)*puVar5;
                uStack_1d0 = puVar5[1];
                puVar5 = (undefined8 *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                local_1c8 = *puVar5;
                uStack_1c0 = puVar5[1];
                (**(code **)(*plVar43 + 0x80))(&cameras,plVar43,&local_1f8);
                pRVar40 = lights.
                          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (lights.
                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar54].ptr != (LightNode *)0x0) {
                  (*((lights.
                      super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar54].ptr)->super_Node).
                    super_RefCount._vptr_RefCount[3])();
                }
                pRVar40[uVar54].ptr =
                     (LightNode *)
                     cameras.
                     super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                lVar53 = lVar53 + 0x40;
              }
              this_00 = (AnimatedLightNode *)::operator_new(0x88);
              SceneGraph::AnimatedLightNode::AnimatedLightNode(this_00,&lights,spaces->time_range);
              local_1f8._0_8_ = this_00;
              (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)group,(Ref<embree::SceneGraph::Node> *)&local_1f8.field_1);
              if ((AnimatedLightNode *)local_1f8._0_8_ != (AnimatedLightNode *)0x0) {
                (**(code **)(*(long *)local_1f8._0_8_ + 0x18))();
              }
              std::
              vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ::~vector(&lights);
            }
            (**(code **)(*plVar43 + 0x18))(plVar43);
          }
        }
        else {
          (**(code **)(*plVar43 + 0x10))(plVar43);
          if ((spaces->spaces).size_active != 1) {
            prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar50,"animated lights cannot get instantiated with a transform animation")
            ;
            __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pAVar12 = (spaces->spaces).items;
          local_1f8._0_8_ = *(undefined8 *)&(pAVar12->l).vx.field_0;
          local_1f8._8_8_ = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + 8);
          local_1e8 = *(size_t *)&(pAVar12->l).vy.field_0;
          sStack_1e0 = *(undefined8 *)((long)&(pAVar12->l).vy.field_0 + 8);
          local_1d8 = *(void **)&(pAVar12->l).vz.field_0;
          uStack_1d0 = *(undefined8 *)((long)&(pAVar12->l).vz.field_0 + 8);
          local_1c8 = *(undefined8 *)&(pAVar12->p).field_0;
          uStack_1c0 = *(undefined8 *)((long)&(pAVar12->p).field_0 + 8);
          (**(code **)(*plVar43 + 0x80))(&cameras,plVar43);
          lights.
          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)cameras.
                        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if (cameras.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)((cameras.
                        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                      _M_dataplus._M_p)();
          }
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      *)group,(Ref<embree::SceneGraph::Node> *)&lights);
          if (lights.
              super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)((lights.
                        super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                      _M_string_length)();
          }
          if (cameras.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)((cameras.
                        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                      _M_string_length)();
          }
          (**(code **)(*plVar43 + 0x18))(plVar43);
        }
      }
      else {
        (**(code **)(*plVar43 + 0x10))(plVar43);
        pRVar14 = (Ref<embree::SceneGraph::Node> *)plVar43[0xe];
        for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar43[0xd]; node_00 != pRVar14;
            node_00 = node_00 + 1) {
          convertLightsAndCameras(this,group,node_00,spaces);
        }
        (**(code **)(*plVar43 + 0x18))(plVar43);
      }
    }
    else {
      auVar114 = (**(code **)(*plVar43 + 0x10))(plVar43);
      uVar54 = auVar114._8_8_;
      sVar11 = (spaces->spaces).size_active;
      if (sVar11 == 1) {
        fVar60 = (spaces->time_range).lower;
        fVar62 = (spaces->time_range).upper;
        fVar61 = (float)plVar43[0xd];
        fVar96 = (float)((ulong)plVar43[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar61);
        uVar58 = -(uint)(fVar62 < fVar96);
        local_1f8._0_8_ =
             CONCAT44(~uVar58 & (uint)fVar96,~uVar56 & (uint)fVar60) |
             CONCAT44((uint)fVar62 & uVar58,(uint)fVar61 & uVar56);
        sVar11 = plVar43[0xf];
        local_1d8 = (void *)0x0;
        local_1e8 = 0;
        sStack_1e0 = 0;
        if (sVar11 != 0) {
          local_1d8 = alignedMalloc(sVar11 << 6,0x10);
          auVar114._8_8_ = extraout_RDX;
          auVar114._0_8_ = local_1d8;
          sStack_1e0 = sVar11;
        }
        uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
        lVar53 = 0x30;
        local_1e8 = sStack_1e0;
        for (uVar54 = 0; uVar55 = uStack_1d0, uVar56 = auVar114._8_4_, uVar54 < (ulong)plVar43[0xf];
            uVar54 = uVar54 + 1) {
          pAVar12 = (spaces->spaces).items;
          lVar13 = plVar43[0x11];
          bVar9 = spaces->quaternion;
          uVar44 = CONCAT71(auVar114._1_7_,bVar9);
          bVar41 = *(byte *)(plVar43 + 0x12);
          uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
          uVar38 = uStack_1d0;
          fVar60 = (pAVar12->l).vx.field_0.m128[0];
          uVar7 = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + 4);
          fVar62 = (float)((ulong)uVar7 >> 0x20);
          local_218 = (float)uVar7;
          uStack_1d0._1_7_ = SUB87(uVar55,1);
          if (((((fVar60 != 1.0) || (NAN(fVar60))) || (local_218 != 0.0)) ||
              ((NAN(local_218) || (fVar62 != 0.0)))) || (NAN(fVar62))) {
LAB_00152ca7:
            uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar53);
            fVar61 = (float)uVar7;
            fVar96 = (float)((ulong)uVar7 >> 0x20);
            iVar57 = -(uint)(fVar61 != 1.0);
            iVar59 = -(uint)(fVar96 != 0.0);
            auVar64._4_4_ = iVar59;
            auVar64._0_4_ = iVar57;
            auVar64._8_4_ = iVar59;
            auVar64._12_4_ = iVar59;
            auVar63._8_8_ = auVar64._8_8_;
            auVar63._4_4_ = iVar57;
            auVar63._0_4_ = iVar57;
            uVar56 = movmskpd(uVar56,auVar63);
            fVar60 = *(float *)(lVar13 + -0x28 + lVar53);
            if (((((uVar56 & 1) == 0) && (bVar52 = (byte)uVar56 >> 1, bVar52 == 0)) &&
                (fVar60 == 0.0)) && (!NAN(fVar60))) {
              pfVar1 = (float *)(lVar13 + -0x24 + lVar53);
              auVar28._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar28._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar28._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar28._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar28);
              if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                 (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                pfVar1 = (float *)(lVar13 + -0x14 + lVar53);
                auVar29._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar29._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar29._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar29._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar29);
                if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                   (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                  pfVar1 = (float *)(lVar13 + -4 + lVar53);
                  auVar30._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar30._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar30._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar30._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar30);
                  if ((((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                       ((uVar56 & 4) == 0)) &&
                      (bVar52 = ((byte)uVar56 & 8) >> 3,
                      uVar55 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0)) &&
                     ((bVar41 == 0 ||
                      ((fVar98 = *(float *)(lVar13 + 0xc + lVar53), fVar98 == 1.0 && (!NAN(fVar98)))
                      )))) {
                    uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar9);
                    fVar81 = (pAVar12->l).vx.field_0.m128[0];
                    local_218 = (pAVar12->l).vx.field_0.m128[1];
                    fVar62 = (pAVar12->l).vx.field_0.m128[2];
                    fVar61 = (pAVar12->l).vx.field_0.m128[3];
                    fVar89 = (pAVar12->l).vy.field_0.m128[0];
                    fVar92 = (pAVar12->l).vy.field_0.m128[1];
                    fVar86 = (pAVar12->l).vy.field_0.m128[2];
                    fVar96 = (pAVar12->l).vy.field_0.m128[3];
                    fVar103 = (pAVar12->l).vz.field_0.m128[0];
                    fVar76 = (pAVar12->l).vz.field_0.m128[1];
                    fVar101 = (pAVar12->l).vz.field_0.m128[2];
                    fVar98 = (pAVar12->l).vz.field_0.m128[3];
                    fVar78 = (pAVar12->p).field_0.m128[0];
                    fVar79 = (pAVar12->p).field_0.m128[1];
                    fVar69 = (pAVar12->p).field_0.m128[2];
                    fVar60 = (pAVar12->p).field_0.m128[3];
                    goto LAB_001533c2;
                  }
                }
              }
            }
            uVar55 = uVar44 & 0xffffffff;
            bVar52 = (byte)uVar55 | bVar41;
            uVar55 = CONCAT71((int7)(uVar55 >> 8),bVar52);
            uStack_1d0 = uVar38;
            if (bVar52 == 0) {
              fVar79 = (pAVar12->l).vx.field_0.m128[0];
              fVar69 = (pAVar12->l).vx.field_0.m128[1];
              fVar104 = (pAVar12->l).vx.field_0.m128[2];
              fVar109 = (pAVar12->l).vx.field_0.m128[3];
              fVar112 = (pAVar12->l).vy.field_0.m128[0];
              fVar70 = (pAVar12->l).vy.field_0.m128[1];
              fVar71 = (pAVar12->l).vy.field_0.m128[2];
              fVar72 = (pAVar12->l).vy.field_0.m128[3];
              fVar73 = (pAVar12->l).vz.field_0.m128[0];
              fVar74 = (pAVar12->l).vz.field_0.m128[1];
              fVar75 = (pAVar12->l).vz.field_0.m128[2];
              fVar110 = (pAVar12->l).vz.field_0.m128[3];
              fVar81 = fVar61 * fVar79 + fVar96 * fVar112 + fVar60 * fVar73;
              local_218 = fVar61 * fVar69 + fVar96 * fVar70 + fVar60 * fVar74;
              fVar62 = fVar61 * fVar104 + fVar96 * fVar71 + fVar60 * fVar75;
              fVar61 = fVar61 * fVar109 + fVar96 * fVar72 + fVar60 * fVar110;
              fVar60 = *(float *)(lVar13 + -0x20 + lVar53);
              fVar96 = *(float *)(lVar13 + -0x1c + lVar53);
              fVar98 = *(float *)(lVar13 + -0x18 + lVar53);
              fVar78 = *(float *)(lVar13 + -0x10 + lVar53);
              fVar89 = fVar60 * fVar79 + fVar96 * fVar112 + fVar98 * fVar73;
              fVar92 = fVar60 * fVar69 + fVar96 * fVar70 + fVar98 * fVar74;
              fVar86 = fVar60 * fVar104 + fVar96 * fVar71 + fVar98 * fVar75;
              fVar96 = fVar60 * fVar109 + fVar96 * fVar72 + fVar98 * fVar110;
              fVar60 = *(float *)(lVar13 + -0xc + lVar53);
              fVar98 = *(float *)(lVar13 + -8 + lVar53);
              fVar103 = fVar78 * fVar79 + fVar60 * fVar112 + fVar98 * fVar73;
              fVar76 = fVar78 * fVar69 + fVar60 * fVar70 + fVar98 * fVar74;
              fVar101 = fVar78 * fVar104 + fVar60 * fVar71 + fVar98 * fVar75;
              fVar98 = fVar78 * fVar109 + fVar60 * fVar72 + fVar98 * fVar110;
              fVar60 = *(float *)(lVar13 + lVar53);
              fVar6 = *(float *)(lVar13 + 4 + lVar53);
              fVar102 = *(float *)(lVar13 + 8 + lVar53);
              fVar78 = fVar60 * fVar79 + fVar6 * fVar112 + fVar102 * fVar73 +
                       (pAVar12->p).field_0.m128[0];
              fVar79 = fVar60 * fVar69 + fVar6 * fVar70 + fVar102 * fVar74 +
                       (pAVar12->p).field_0.m128[1];
              fVar69 = fVar60 * fVar104 + fVar6 * fVar71 + fVar102 * fVar75 +
                       (pAVar12->p).field_0.m128[2];
              fVar60 = fVar60 * fVar109 + fVar6 * fVar72 + fVar102 * fVar110 +
                       (pAVar12->p).field_0.m128[3];
            }
            else {
              uVar44 = uVar44 & 0xffffffff;
              bVar52 = (byte)uVar44 & bVar41;
              uVar55 = CONCAT71((int7)(uVar44 >> 8),bVar52);
              if (bVar52 == 1) {
                poVar45 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar45);
                fVar60 = (pAVar12->p).field_0.m128[3];
                fVar62 = (pAVar12->l).vx.field_0.m128[3];
                fVar61 = (pAVar12->l).vy.field_0.m128[3];
                fVar96 = (pAVar12->l).vz.field_0.m128[3];
                aVar8 = (pAVar12->l).vx.field_0.field_1;
                fVar98 = (pAVar12->l).vy.field_0.m128[0];
                fVar103 = (pAVar12->l).vy.field_0.m128[1];
                fVar76 = (pAVar12->l).vz.field_0.m128[0];
                fVar78 = (pAVar12->l).vz.field_0.m128[1];
                fVar79 = (pAVar12->l).vz.field_0.m128[2];
                fVar104 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar101 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar102 = fVar61 * fVar61 + fVar101 + -fVar96 * fVar96;
                fVar112 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar69 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar109 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar60 = fVar61 * fVar96 - fVar60 * fVar62;
                fVar89 = (pAVar12->p).field_0.m128[0];
                fVar92 = (pAVar12->p).field_0.m128[1];
                fVar6 = (pAVar12->p).field_0.m128[2];
                fVar104 = fVar104 + fVar104;
                fVar112 = fVar112 + fVar112;
                fVar81 = fVar81 + fVar81;
                fVar109 = fVar109 + fVar109;
                fVar69 = fVar69 + fVar69;
                fVar60 = fVar60 + fVar60;
                fVar62 = fVar96 * fVar96 + fVar101 + -fVar61 * fVar61;
                fVar87 = fVar86 * 1.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar90 = fVar86 * 0.0 + fVar104 * 1.0 + fVar112 * 0.0;
                fVar93 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 1.0;
                fVar95 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar82 = fVar81 * 1.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar83 = fVar81 * 0.0 + fVar102 * 1.0 + fVar109 * 0.0;
                fVar84 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 1.0;
                fVar85 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar102 = fVar69 * 1.0 + fVar60 * 0.0 + fVar62 * 0.0;
                fVar109 = fVar69 * 0.0 + fVar60 * 1.0 + fVar62 * 0.0;
                fVar70 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 1.0;
                fVar72 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 0.0;
                local_208 = aVar8.y;
                fStack_204 = aVar8.z;
                local_218 = aVar8.x;
                fVar105 = local_218 * fVar87 + fVar82 * 0.0 + fVar102 * 0.0;
                fVar106 = local_218 * fVar90 + fVar83 * 0.0 + fVar109 * 0.0;
                fVar107 = local_218 * fVar93 + fVar84 * 0.0 + fVar70 * 0.0;
                fVar108 = local_218 * fVar95 + fVar85 * 0.0 + fVar72 * 0.0;
                fVar104 = fVar98 * fVar87 + fVar103 * fVar82 + fVar102 * 0.0;
                fVar112 = fVar98 * fVar90 + fVar103 * fVar83 + fVar109 * 0.0;
                fVar71 = fVar98 * fVar93 + fVar103 * fVar84 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar95 + fVar103 * fVar85 + fVar72 * 0.0;
                local_188 = fVar76 * fVar87 + fVar78 * fVar82 + fVar79 * fVar102;
                fStack_184 = fVar76 * fVar90 + fVar78 * fVar83 + fVar79 * fVar109;
                fStack_180 = fVar76 * fVar93 + fVar78 * fVar84 + fVar79 * fVar70;
                fStack_17c = fVar76 * fVar95 + fVar78 * fVar85 + fVar79 * fVar72;
                fVar60 = *(float *)(lVar13 + 0xc + lVar53);
                fVar62 = *(float *)(lVar13 + -0x24 + lVar53);
                fVar61 = *(float *)(lVar13 + -0x14 + lVar53);
                fVar96 = *(float *)(lVar13 + -4 + lVar53);
                fVar101 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar103 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar111 = fVar61 * fVar61 + fVar103 + -fVar96 * fVar96;
                fVar110 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar77 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar113 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar69 = fVar61 * fVar96 - fVar60 * fVar62;
                pfVar2 = (float *)(lVar13 + -0x30 + lVar53);
                fVar60 = *pfVar2;
                pfVar3 = (float *)(lVar13 + -0x20 + lVar53);
                fVar62 = *pfVar3;
                fVar98 = pfVar3[1];
                fVar97 = fVar96 * fVar96 + fVar103 + -fVar61 * fVar61;
                pfVar1 = (float *)(lVar13 + -0x10 + lVar53);
                fVar61 = *pfVar1;
                fVar96 = pfVar1[1];
                fVar103 = pfVar1[2];
                fVar101 = fVar101 + fVar101;
                fVar110 = fVar110 + fVar110;
                pfVar1 = (float *)(lVar13 + lVar53);
                fVar76 = *pfVar1;
                fVar78 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar74 = fVar86 * 1.0 + fVar101 * 0.0 + fVar110 * 0.0;
                fVar75 = fVar86 * 0.0 + fVar101 * 1.0 + fVar110 * 0.0;
                fVar110 = fVar86 * 0.0 + fVar101 * 0.0 + fVar110 * 1.0;
                fVar81 = fVar81 + fVar81;
                fVar113 = fVar113 + fVar113;
                fVar77 = fVar77 + fVar77;
                fVar69 = fVar69 + fVar69;
                fVar86 = fVar81 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                fVar101 = fVar81 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                fVar81 = fVar81 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                fVar111 = fVar77 * 1.0 + fVar69 * 0.0 + fVar97 * 0.0;
                fVar113 = fVar77 * 0.0 + fVar69 * 1.0 + fVar97 * 0.0;
                fVar69 = fVar77 * 0.0 + fVar69 * 0.0 + fVar97 * 1.0;
                fVar88 = fVar60 * fVar74 + fVar86 * 0.0 + fVar111 * 0.0;
                fVar91 = fVar60 * fVar75 + fVar101 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar60 * fVar110 + fVar81 * 0.0 + fVar69 * 0.0;
                fVar77 = fVar62 * fVar74 + fVar98 * fVar86 + fVar111 * 0.0;
                fVar97 = fVar62 * fVar75 + fVar98 * fVar101 + fVar113 * 0.0;
                fVar80 = fVar62 * fVar110 + fVar98 * fVar81 + fVar69 * 0.0;
                fVar98 = fVar61 * fVar74 + fVar96 * fVar86 + fVar103 * fVar111;
                fVar99 = fVar61 * fVar75 + fVar96 * fVar101 + fVar103 * fVar113;
                fVar100 = fVar61 * fVar110 + fVar96 * fVar81 + fVar103 * fVar69;
                fVar60 = fVar76 * fVar74 + fVar78 * fVar86 + fVar79 * fVar111 + pfVar2[1] + 0.0;
                fVar74 = fVar76 * fVar75 + fVar78 * fVar101 + fVar79 * fVar113 + pfVar2[2] + 0.0;
                fVar75 = fVar76 * fVar110 + fVar78 * fVar81 + fVar79 * fVar69 + pfVar3[2] + 0.0;
                fVar81 = fVar88 * fVar105 + fVar91 * fVar104 + fVar94 * local_188;
                local_218 = fVar88 * fVar106 + fVar91 * fVar112 + fVar94 * fStack_184;
                fVar62 = fVar88 * fVar107 + fVar91 * fVar71 + fVar94 * fStack_180;
                fVar61 = fVar88 * fVar108 + fVar91 * fVar73 + fVar94 * fStack_17c;
                fVar86 = fVar77 * fVar107 + fVar97 * fVar71 + fVar80 * fStack_180;
                fVar96 = fVar77 * fVar108 + fVar97 * fVar73 + fVar80 * fStack_17c;
                fVar103 = fVar98 * fVar105 + fVar99 * fVar104 + fVar100 * local_188;
                fVar76 = fVar98 * fVar106 + fVar99 * fVar112 + fVar100 * fStack_184;
                fVar101 = fVar98 * fVar107 + fVar99 * fVar71 + fVar100 * fStack_180;
                fVar98 = fVar98 * fVar108 + fVar99 * fVar73 + fVar100 * fStack_17c;
                fVar78 = fVar60 * fVar105 + fVar74 * fVar104 + fVar75 * local_188 +
                         fVar89 * fVar87 + fVar92 * fVar82 + fVar6 * fVar102 + local_208 + 0.0;
                fVar79 = fVar60 * fVar106 + fVar74 * fVar112 + fVar75 * fStack_184 +
                         fVar89 * fVar90 + fVar92 * fVar83 + fVar6 * fVar109 + fStack_204 + 0.0;
                fVar69 = fVar60 * fVar107 + fVar74 * fVar71 + fVar75 * fStack_180 +
                         fVar89 * fVar93 + fVar92 * fVar84 + fVar6 * fVar70 +
                         (pAVar12->l).vy.field_0.m128[2] + 0.0;
                fVar60 = fVar60 * fVar108 + fVar74 * fVar73 + fVar75 * fStack_17c +
                         fVar89 * fVar95 + fVar92 * fVar85 + fVar6 * fVar72 + 0.0;
                uVar55 = extraout_RDX_00;
                fVar89 = fVar77 * fVar105 + fVar97 * fVar104 + fVar80 * local_188;
                fVar92 = fVar77 * fVar106 + fVar97 * fVar112 + fVar80 * fStack_184;
              }
              else {
                bVar41 = bVar9 ^ 1U | bVar41;
                if (bVar41 == 0) {
                  fVar60 = (pAVar12->p).field_0.m128[3];
                  fVar61 = (pAVar12->l).vx.field_0.m128[3];
                  fVar96 = (pAVar12->l).vy.field_0.m128[3];
                  fVar98 = (pAVar12->l).vz.field_0.m128[3];
                  fVar70 = (pAVar12->l).vy.field_0.m128[0];
                  fVar71 = (pAVar12->l).vy.field_0.m128[1];
                  fVar86 = (pAVar12->l).vy.field_0.m128[2];
                  fVar76 = (pAVar12->l).vz.field_0.m128[0];
                  fVar89 = (pAVar12->l).vz.field_0.m128[1];
                  fVar92 = (pAVar12->l).vz.field_0.m128[2];
                  fVar103 = (pAVar12->l).vx.field_0.m128[0];
                  pfVar1 = (float *)(lVar13 + -0x30 + lVar53);
                  fVar78 = *pfVar1;
                  fVar79 = pfVar1[1];
                  fVar69 = pfVar1[2];
                  pfVar1 = (float *)(lVar13 + -0x20 + lVar53);
                  fVar101 = *pfVar1;
                  fVar6 = pfVar1[1];
                  fVar102 = pfVar1[2];
                  puVar5 = (undefined8 *)(lVar13 + -0x10 + lVar53);
                  uVar7 = *puVar5;
                  uVar37 = puVar5[1];
                  pfVar1 = (float *)(lVar13 + lVar53);
                  fVar104 = *pfVar1;
                  fVar109 = pfVar1[1];
                  fVar112 = pfVar1[2];
                  fVar81 = fVar78 * fVar103 + fVar79 * fVar70 + fVar69 * fVar76;
                  fVar72 = fVar78 * 0.0 + fVar79 * fVar71 + fVar69 * fVar89;
                  fVar73 = fVar78 * 0.0 + fVar79 * 0.0 + fVar69 * fVar92;
                  local_188 = fVar101 * fVar103 + fVar6 * fVar70 + fVar102 * fVar76;
                  fStack_184 = fVar101 * 0.0 + fVar6 * fVar71 + fVar102 * fVar89;
                  fStack_180 = fVar101 * 0.0 + fVar6 * 0.0 + fVar102 * fVar92;
                  fStack_17c = fVar101 * (pAVar12->l).vx.field_0.m128[1] +
                               fVar6 * (pAVar12->l).vy.field_0.m128[3] +
                               fVar102 * (pAVar12->l).vz.field_0.m128[3];
                  fVar78 = fVar104 * fVar103 + fVar109 * fVar70 + fVar112 * fVar76 +
                           (pAVar12->p).field_0.m128[0];
                  fVar79 = fVar104 * 0.0 + fVar109 * fVar71 + fVar112 * fVar89 +
                           (pAVar12->p).field_0.m128[1];
                  fVar69 = fVar104 * 0.0 + fVar109 * 0.0 + fVar112 * fVar92 +
                           (pAVar12->p).field_0.m128[2];
                  if (((fVar72 != 0.0) || (NAN(fVar72))) ||
                     ((fVar73 != 0.0 ||
                      (((NAN(fVar73) || (fStack_180 != 0.0)) || (NAN(fStack_180))))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar55 = extraout_RDX_02;
                  }
                  local_138 = (float)uVar7;
                  fStack_134 = (float)((ulong)uVar7 >> 0x20);
                  fStack_130 = (float)uVar37;
                  fVar103 = fVar103 * local_138 + fVar70 * fStack_134 + fVar76 * fStack_130;
                  fVar76 = local_138 * 0.0 + fVar71 * fStack_134 + fVar89 * fStack_130;
                  fVar101 = local_138 * 0.0 + fStack_134 * 0.0 + fVar92 * fStack_130;
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = local_188;
                  fVar92 = fStack_184;
                }
                else {
                  if (((local_218 != 0.0) || (NAN(local_218))) ||
                     ((fVar62 != 0.0 ||
                      ((NAN(fVar62) ||
                       (uVar7 = *(undefined8 *)&(pAVar12->l).vz.field_0,
                       auVar19._4_4_ = -(uint)((pAVar12->l).vy.field_0.m128[0] != 0.0),
                       auVar19._0_4_ = -(uint)((pAVar12->l).vy.field_0.m128[2] != 0.0),
                       auVar19._8_4_ = -(uint)((float)uVar7 != 0.0),
                       auVar19._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                       uVar42 = movmskps((int)CONCAT71(auVar114._1_7_,bVar41),auVar19),
                       (char)uVar42 != '\0')))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar55 = extraout_RDX_01;
                  }
                  pfVar2 = (float *)(lVar13 + -0x30 + lVar53);
                  fVar61 = pfVar2[3];
                  pfVar3 = (float *)(lVar13 + -0x20 + lVar53);
                  fVar96 = pfVar3[3];
                  pfVar4 = (float *)(lVar13 + -0x10 + lVar53);
                  fVar103 = *pfVar4;
                  fVar76 = pfVar4[1];
                  fVar98 = pfVar4[3];
                  pfVar1 = (float *)(lVar13 + lVar53);
                  fVar78 = *pfVar1;
                  fVar79 = pfVar1[1];
                  fVar69 = pfVar1[2];
                  fVar60 = pfVar1[3];
                  uVar7 = *(undefined8 *)&(pAVar12->p).field_0;
                  fVar81 = (pAVar12->l).vx.field_0.m128[0] * *pfVar2;
                  local_218 = pfVar2[1] + (float)uVar7;
                  fVar62 = pfVar2[2] + (float)((ulong)uVar7 >> 0x20);
                  fVar86 = pfVar3[2] + (pAVar12->p).field_0.m128[2];
                  fVar101 = pfVar4[2] * (pAVar12->l).vz.field_0.m128[2];
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = *pfVar3;
                  fVar92 = pfVar3[1] * (pAVar12->l).vy.field_0.m128[1];
                }
              }
            }
          }
          else {
            auVar16._4_4_ = -(uint)((pAVar12->l).vy.field_0.m128[0] != 0.0);
            auVar16._0_4_ = -(uint)((pAVar12->l).vx.field_0.m128[3] != 0.0);
            auVar16._8_4_ = -(uint)((pAVar12->l).vy.field_0.m128[1] != 1.0);
            auVar16._12_4_ = -(uint)((pAVar12->l).vy.field_0.m128[2] != 0.0);
            uVar56 = movmskps(uVar56,auVar16);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
               (((uVar56 & 4) != 0 ||
                (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                bVar52 != 0)))) goto LAB_00152ca7;
            auVar17._4_4_ = -(uint)((pAVar12->l).vz.field_0.m128[0] != 0.0);
            auVar17._0_4_ = -(uint)((pAVar12->l).vy.field_0.m128[3] != 0.0);
            auVar17._8_4_ = -(uint)((pAVar12->l).vz.field_0.m128[1] != 0.0);
            auVar17._12_4_ = -(uint)((pAVar12->l).vz.field_0.m128[2] != 1.0);
            uVar56 = movmskps(uVar56,auVar17);
            if (((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0)) ||
               (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
               bVar52 != 0)) goto LAB_00152ca7;
            auVar18._4_4_ = -(uint)((pAVar12->p).field_0.m128[0] != 0.0);
            auVar18._0_4_ = -(uint)((pAVar12->l).vz.field_0.m128[3] != 0.0);
            auVar18._8_4_ = -(uint)((pAVar12->p).field_0.m128[1] != 0.0);
            auVar18._12_4_ = -(uint)((pAVar12->p).field_0.m128[2] != 0.0);
            uVar56 = movmskps(uVar56,auVar18);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
            goto LAB_00152ca7;
            bVar52 = ((byte)uVar56 & 8) >> 3;
            uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
            uVar55 = (ulong)uVar56;
            if ((bVar52 != 0) ||
               ((bVar9 != false &&
                ((fVar60 = (pAVar12->p).field_0.m128[3], fVar60 != 1.0 || (NAN(fVar60)))))))
            goto LAB_00152ca7;
            uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar41);
            pfVar1 = (float *)(lVar13 + -0x30 + lVar53);
            fVar81 = *pfVar1;
            local_218 = pfVar1[1];
            fVar62 = pfVar1[2];
            fVar61 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x20 + lVar53);
            fVar89 = *pfVar1;
            fVar92 = pfVar1[1];
            fVar86 = pfVar1[2];
            fVar96 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x10 + lVar53);
            fVar103 = *pfVar1;
            fVar76 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar98 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + lVar53);
            fVar78 = *pfVar1;
            fVar79 = pfVar1[1];
            fVar69 = pfVar1[2];
            fVar60 = pfVar1[3];
          }
LAB_001533c2:
          auVar114._8_8_ = uVar55;
          auVar114._0_8_ = local_1d8;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x30);
          *pfVar1 = fVar81;
          pfVar1[1] = local_218;
          pfVar1[2] = fVar62;
          pfVar1[3] = fVar61;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x20);
          *pfVar1 = fVar89;
          pfVar1[1] = fVar92;
          pfVar1[2] = fVar86;
          pfVar1[3] = fVar96;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x10);
          *pfVar1 = fVar103;
          pfVar1[1] = fVar76;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar98;
          pfVar1 = (float *)((long)local_1d8 + lVar53);
          *pfVar1 = fVar78;
          pfVar1[1] = fVar79;
          pfVar1[2] = fVar69;
          pfVar1[3] = fVar60;
          lVar53 = lVar53 + 0x40;
        }
      }
      else if (plVar43[0xf] == 1) {
        fVar60 = (spaces->time_range).lower;
        fVar62 = (spaces->time_range).upper;
        fVar61 = (float)plVar43[0xd];
        fVar96 = (float)((ulong)plVar43[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar61);
        uVar58 = -(uint)(fVar62 < fVar96);
        local_1f8._0_8_ =
             CONCAT44(~uVar58 & (uint)fVar96,~uVar56 & (uint)fVar60) |
             CONCAT44((uint)fVar62 & uVar58,(uint)fVar61 & uVar56);
        local_1d8 = (void *)0x0;
        local_1e8 = 0;
        sStack_1e0 = 0;
        if (sVar11 != 0) {
          local_1d8 = alignedMalloc(sVar11 << 6,0x10);
          uVar54 = extraout_RDX_03;
          sStack_1e0 = sVar11;
        }
        if (spaces->quaternion == false) {
          pvVar46 = (void *)(ulong)*(uint *)(plVar43 + 0x12);
        }
        else {
          pvVar46 = (void *)0x1;
        }
        uStack_1d0 = CONCAT71(uStack_1d0._1_7_,(char)pvVar46);
        lVar53 = 0x30;
        local_1e8 = sStack_1e0;
        for (uVar55 = 0; uVar38 = uStack_1d0, uVar56 = (uint)uVar54,
            uVar55 < (spaces->spaces).size_active; uVar55 = uVar55 + 1) {
          pAVar12 = (spaces->spaces).items;
          pfVar1 = (float *)plVar43[0x11];
          bVar9 = spaces->quaternion;
          uVar51 = (undefined7)((ulong)pvVar46 >> 8);
          uVar47 = CONCAT71(uVar51,bVar9);
          bVar41 = *(byte *)(plVar43 + 0x12);
          uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
          uVar44 = uStack_1d0;
          fVar60 = *(float *)((long)pAVar12 + lVar53 + -0x30);
          uVar7 = *(undefined8 *)((long)pAVar12 + lVar53 + -0x2c);
          fVar62 = (float)((ulong)uVar7 >> 0x20);
          local_218 = (float)uVar7;
          uStack_1d0._1_7_ = SUB87(uVar38,1);
          if ((((fVar60 != 1.0) || (NAN(fVar60))) || (local_218 != 0.0)) ||
             (((NAN(local_218) || (fVar62 != 0.0)) || (NAN(fVar62))))) {
LAB_00153ab9:
            fVar61 = (float)*(undefined8 *)pfVar1;
            fVar96 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
            iVar57 = -(uint)(fVar61 != 1.0);
            iVar59 = -(uint)(fVar96 != 0.0);
            auVar66._4_4_ = iVar59;
            auVar66._0_4_ = iVar57;
            auVar66._8_4_ = iVar59;
            auVar66._12_4_ = iVar59;
            auVar65._8_8_ = auVar66._8_8_;
            auVar65._4_4_ = iVar57;
            auVar65._0_4_ = iVar57;
            uVar56 = movmskpd(uVar56,auVar65);
            fVar60 = pfVar1[2];
            if (((((uVar56 & 1) == 0) && (bVar52 = (byte)uVar56 >> 1, bVar52 == 0)) &&
                (fVar60 == 0.0)) && (!NAN(fVar60))) {
              auVar31._4_4_ = -(uint)(pfVar1[4] != 0.0);
              auVar31._0_4_ = -(uint)(pfVar1[3] != 0.0);
              auVar31._8_4_ = -(uint)(pfVar1[5] != 1.0);
              auVar31._12_4_ = -(uint)(pfVar1[6] != 0.0);
              uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar31);
              if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                 (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                auVar32._4_4_ = -(uint)(pfVar1[8] != 0.0);
                auVar32._0_4_ = -(uint)(pfVar1[7] != 0.0);
                auVar32._8_4_ = -(uint)(pfVar1[9] != 0.0);
                auVar32._12_4_ = -(uint)(pfVar1[10] != 1.0);
                uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar32);
                if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                   (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                  auVar33._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                  auVar33._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                  auVar33._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                  auVar33._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                  uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar33);
                  if (((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                      ((uVar56 & 4) == 0)) &&
                     ((bVar52 = ((byte)uVar56 & 8) >> 3,
                      uVar54 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0 &&
                      ((bVar41 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))))) {
                    uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar9);
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x30);
                    fVar81 = *pfVar1;
                    local_218 = pfVar1[1];
                    fVar62 = pfVar1[2];
                    fVar61 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x20);
                    fVar89 = *pfVar1;
                    fVar92 = pfVar1[1];
                    fVar86 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x10);
                    fVar103 = *pfVar1;
                    fVar76 = pfVar1[1];
                    fVar101 = pfVar1[2];
                    fVar98 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                    fVar78 = *pfVar1;
                    fVar79 = pfVar1[1];
                    fVar69 = pfVar1[2];
                    fVar60 = pfVar1[3];
                    goto LAB_001541c9;
                  }
                }
              }
            }
            uVar54 = uVar47 & 0xffffffff;
            bVar52 = (byte)uVar54 | bVar41;
            uVar54 = CONCAT71((int7)(uVar54 >> 8),bVar52);
            uStack_1d0 = uVar44;
            if (bVar52 == 0) {
              pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x30);
              fVar79 = *pfVar2;
              fVar69 = pfVar2[1];
              fVar104 = pfVar2[2];
              fVar109 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x20);
              fVar112 = *pfVar2;
              fVar70 = pfVar2[1];
              fVar71 = pfVar2[2];
              fVar72 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x10);
              fVar73 = *pfVar2;
              fVar74 = pfVar2[1];
              fVar75 = pfVar2[2];
              fVar110 = pfVar2[3];
              fVar81 = fVar61 * fVar79 + fVar96 * fVar112 + fVar60 * fVar73;
              local_218 = fVar61 * fVar69 + fVar96 * fVar70 + fVar60 * fVar74;
              fVar62 = fVar61 * fVar104 + fVar96 * fVar71 + fVar60 * fVar75;
              fVar61 = fVar61 * fVar109 + fVar96 * fVar72 + fVar60 * fVar110;
              fVar60 = pfVar1[4];
              fVar96 = pfVar1[5];
              fVar98 = pfVar1[6];
              fVar78 = pfVar1[8];
              fVar89 = fVar60 * fVar79 + fVar96 * fVar112 + fVar98 * fVar73;
              fVar92 = fVar60 * fVar69 + fVar96 * fVar70 + fVar98 * fVar74;
              fVar86 = fVar60 * fVar104 + fVar96 * fVar71 + fVar98 * fVar75;
              fVar96 = fVar60 * fVar109 + fVar96 * fVar72 + fVar98 * fVar110;
              fVar60 = pfVar1[9];
              fVar98 = pfVar1[10];
              fVar103 = fVar78 * fVar79 + fVar60 * fVar112 + fVar98 * fVar73;
              fVar76 = fVar78 * fVar69 + fVar60 * fVar70 + fVar98 * fVar74;
              fVar101 = fVar78 * fVar104 + fVar60 * fVar71 + fVar98 * fVar75;
              fVar98 = fVar78 * fVar109 + fVar60 * fVar72 + fVar98 * fVar110;
              fVar60 = pfVar1[0xc];
              fVar6 = pfVar1[0xd];
              fVar102 = pfVar1[0xe];
              pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
              fVar78 = fVar60 * fVar79 + fVar6 * fVar112 + fVar102 * fVar73 + *pfVar1;
              fVar79 = fVar60 * fVar69 + fVar6 * fVar70 + fVar102 * fVar74 + pfVar1[1];
              fVar69 = fVar60 * fVar104 + fVar6 * fVar71 + fVar102 * fVar75 + pfVar1[2];
              fVar60 = fVar60 * fVar109 + fVar6 * fVar72 + fVar102 * fVar110 + pfVar1[3];
            }
            else {
              uVar47 = uVar47 & 0xffffffff;
              bVar52 = (byte)uVar47 & bVar41;
              uVar54 = CONCAT71((int7)(uVar47 >> 8),bVar52);
              if (bVar52 == 1) {
                poVar45 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar45);
                fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc);
                fVar62 = *(float *)((long)pAVar12 + lVar53 + -0x24);
                fVar61 = *(float *)((long)pAVar12 + lVar53 + -0x14);
                fVar96 = *(float *)((long)pAVar12 + lVar53 + -4);
                auVar114 = *(undefined1 (*) [16])((long)pAVar12 + lVar53 + -0x30);
                pfVar3 = (float *)((long)pAVar12 + lVar53 + -0x20);
                fVar98 = *pfVar3;
                fVar103 = pfVar3[1];
                pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x10);
                fVar76 = *pfVar2;
                fVar78 = pfVar2[1];
                fVar79 = pfVar2[2];
                fVar104 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar101 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar102 = fVar61 * fVar61 + fVar101 + -fVar96 * fVar96;
                fVar112 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar69 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar109 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar60 = fVar61 * fVar96 - fVar60 * fVar62;
                pfVar2 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                fVar89 = *pfVar2;
                fVar92 = pfVar2[1];
                fVar6 = pfVar2[2];
                fVar104 = fVar104 + fVar104;
                fVar112 = fVar112 + fVar112;
                fVar81 = fVar81 + fVar81;
                fVar109 = fVar109 + fVar109;
                fVar69 = fVar69 + fVar69;
                fVar60 = fVar60 + fVar60;
                fVar62 = fVar96 * fVar96 + fVar101 + -fVar61 * fVar61;
                fVar87 = fVar86 * 1.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar90 = fVar86 * 0.0 + fVar104 * 1.0 + fVar112 * 0.0;
                fVar93 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 1.0;
                fVar95 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar82 = fVar81 * 1.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar83 = fVar81 * 0.0 + fVar102 * 1.0 + fVar109 * 0.0;
                fVar84 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 1.0;
                fVar85 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar102 = fVar69 * 1.0 + fVar60 * 0.0 + fVar62 * 0.0;
                fVar109 = fVar69 * 0.0 + fVar60 * 1.0 + fVar62 * 0.0;
                fVar70 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 1.0;
                fVar72 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 0.0;
                local_208 = auVar114._4_4_;
                fStack_204 = auVar114._8_4_;
                local_218 = auVar114._0_4_;
                fVar105 = local_218 * fVar87 + fVar82 * 0.0 + fVar102 * 0.0;
                fVar106 = local_218 * fVar90 + fVar83 * 0.0 + fVar109 * 0.0;
                fVar107 = local_218 * fVar93 + fVar84 * 0.0 + fVar70 * 0.0;
                fVar108 = local_218 * fVar95 + fVar85 * 0.0 + fVar72 * 0.0;
                fVar104 = fVar98 * fVar87 + fVar103 * fVar82 + fVar102 * 0.0;
                fVar112 = fVar98 * fVar90 + fVar103 * fVar83 + fVar109 * 0.0;
                fVar71 = fVar98 * fVar93 + fVar103 * fVar84 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar95 + fVar103 * fVar85 + fVar72 * 0.0;
                local_188 = fVar76 * fVar87 + fVar78 * fVar82 + fVar79 * fVar102;
                fStack_184 = fVar76 * fVar90 + fVar78 * fVar83 + fVar79 * fVar109;
                fStack_180 = fVar76 * fVar93 + fVar78 * fVar84 + fVar79 * fVar70;
                fStack_17c = fVar76 * fVar95 + fVar78 * fVar85 + fVar79 * fVar72;
                fVar60 = pfVar1[0xf];
                fVar62 = pfVar1[3];
                fVar61 = pfVar1[7];
                fVar96 = pfVar1[0xb];
                fVar101 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar103 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar111 = fVar61 * fVar61 + fVar103 + -fVar96 * fVar96;
                fVar110 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar77 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar113 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar69 = fVar61 * fVar96 - fVar60 * fVar62;
                fVar60 = *pfVar1;
                fVar62 = pfVar1[4];
                fVar98 = pfVar1[5];
                fVar97 = fVar96 * fVar96 + fVar103 + -fVar61 * fVar61;
                fVar61 = pfVar1[8];
                fVar96 = pfVar1[9];
                fVar103 = pfVar1[10];
                fVar101 = fVar101 + fVar101;
                fVar110 = fVar110 + fVar110;
                fVar76 = pfVar1[0xc];
                fVar78 = pfVar1[0xd];
                fVar79 = pfVar1[0xe];
                fVar74 = fVar86 * 1.0 + fVar101 * 0.0 + fVar110 * 0.0;
                fVar75 = fVar86 * 0.0 + fVar101 * 1.0 + fVar110 * 0.0;
                fVar110 = fVar86 * 0.0 + fVar101 * 0.0 + fVar110 * 1.0;
                fVar81 = fVar81 + fVar81;
                fVar113 = fVar113 + fVar113;
                fVar77 = fVar77 + fVar77;
                fVar69 = fVar69 + fVar69;
                fVar86 = fVar81 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                fVar101 = fVar81 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                fVar81 = fVar81 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                fVar111 = fVar77 * 1.0 + fVar69 * 0.0 + fVar97 * 0.0;
                fVar113 = fVar77 * 0.0 + fVar69 * 1.0 + fVar97 * 0.0;
                fVar69 = fVar77 * 0.0 + fVar69 * 0.0 + fVar97 * 1.0;
                fVar88 = fVar60 * fVar74 + fVar86 * 0.0 + fVar111 * 0.0;
                fVar91 = fVar60 * fVar75 + fVar101 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar60 * fVar110 + fVar81 * 0.0 + fVar69 * 0.0;
                fVar77 = fVar62 * fVar74 + fVar98 * fVar86 + fVar111 * 0.0;
                fVar97 = fVar62 * fVar75 + fVar98 * fVar101 + fVar113 * 0.0;
                fVar80 = fVar62 * fVar110 + fVar98 * fVar81 + fVar69 * 0.0;
                fVar98 = fVar61 * fVar74 + fVar96 * fVar86 + fVar103 * fVar111;
                fVar99 = fVar61 * fVar75 + fVar96 * fVar101 + fVar103 * fVar113;
                fVar100 = fVar61 * fVar110 + fVar96 * fVar81 + fVar103 * fVar69;
                fVar60 = fVar76 * fVar74 + fVar78 * fVar86 + fVar79 * fVar111 + pfVar1[1] + 0.0;
                fVar74 = fVar76 * fVar75 + fVar78 * fVar101 + fVar79 * fVar113 + pfVar1[2] + 0.0;
                fVar75 = fVar76 * fVar110 + fVar78 * fVar81 + fVar79 * fVar69 + pfVar1[6] + 0.0;
                fVar81 = fVar88 * fVar105 + fVar91 * fVar104 + fVar94 * local_188;
                local_218 = fVar88 * fVar106 + fVar91 * fVar112 + fVar94 * fStack_184;
                fVar62 = fVar88 * fVar107 + fVar91 * fVar71 + fVar94 * fStack_180;
                fVar61 = fVar88 * fVar108 + fVar91 * fVar73 + fVar94 * fStack_17c;
                fVar86 = fVar77 * fVar107 + fVar97 * fVar71 + fVar80 * fStack_180;
                fVar96 = fVar77 * fVar108 + fVar97 * fVar73 + fVar80 * fStack_17c;
                fVar103 = fVar98 * fVar105 + fVar99 * fVar104 + fVar100 * local_188;
                fVar76 = fVar98 * fVar106 + fVar99 * fVar112 + fVar100 * fStack_184;
                fVar101 = fVar98 * fVar107 + fVar99 * fVar71 + fVar100 * fStack_180;
                fVar98 = fVar98 * fVar108 + fVar99 * fVar73 + fVar100 * fStack_17c;
                fVar78 = fVar60 * fVar105 + fVar74 * fVar104 + fVar75 * local_188 +
                         fVar89 * fVar87 + fVar92 * fVar82 + fVar6 * fVar102 + local_208 + 0.0;
                fVar79 = fVar60 * fVar106 + fVar74 * fVar112 + fVar75 * fStack_184 +
                         fVar89 * fVar90 + fVar92 * fVar83 + fVar6 * fVar109 + fStack_204 + 0.0;
                fVar69 = fVar60 * fVar107 + fVar74 * fVar71 + fVar75 * fStack_180 +
                         fVar89 * fVar93 + fVar92 * fVar84 + fVar6 * fVar70 + pfVar3[2] + 0.0;
                fVar60 = fVar60 * fVar108 + fVar74 * fVar73 + fVar75 * fStack_17c +
                         fVar89 * fVar95 + fVar92 * fVar85 + fVar6 * fVar72 + 0.0;
                uVar54 = extraout_RDX_05;
                fVar89 = fVar77 * fVar105 + fVar97 * fVar104 + fVar80 * local_188;
                fVar92 = fVar77 * fVar106 + fVar97 * fVar112 + fVar80 * fStack_184;
              }
              else {
                bVar41 = bVar9 ^ 1U | bVar41;
                if (bVar41 == 0) {
                  fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc);
                  fVar61 = *(float *)((long)pAVar12 + lVar53 + -0x24);
                  fVar96 = *(float *)((long)pAVar12 + lVar53 + -0x14);
                  fVar98 = *(float *)((long)pAVar12 + lVar53 + -4);
                  pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x20);
                  fVar70 = *pfVar2;
                  fVar71 = pfVar2[1];
                  fVar86 = pfVar2[2];
                  pfVar3 = (float *)((long)pAVar12 + lVar53 + -0x10);
                  fVar76 = *pfVar3;
                  fVar89 = pfVar3[1];
                  fVar92 = pfVar3[2];
                  pfVar4 = (float *)((long)pAVar12 + lVar53 + -0x30);
                  fVar103 = *pfVar4;
                  fVar78 = *pfVar1;
                  fVar79 = pfVar1[1];
                  fVar69 = pfVar1[2];
                  fVar101 = pfVar1[4];
                  fVar6 = pfVar1[5];
                  fVar102 = pfVar1[6];
                  uVar7 = *(undefined8 *)(pfVar1 + 8);
                  uVar37 = *(undefined8 *)(pfVar1 + 10);
                  fVar104 = pfVar1[0xc];
                  fVar109 = pfVar1[0xd];
                  fVar112 = pfVar1[0xe];
                  fVar81 = fVar78 * fVar103 + fVar79 * fVar70 + fVar69 * fVar76;
                  fVar72 = fVar78 * 0.0 + fVar79 * fVar71 + fVar69 * fVar89;
                  fVar73 = fVar78 * 0.0 + fVar79 * 0.0 + fVar69 * fVar92;
                  local_188 = fVar101 * fVar103 + fVar6 * fVar70 + fVar102 * fVar76;
                  fStack_184 = fVar101 * 0.0 + fVar6 * fVar71 + fVar102 * fVar89;
                  fStack_180 = fVar101 * 0.0 + fVar6 * 0.0 + fVar102 * fVar92;
                  fStack_17c = fVar101 * pfVar4[1] + fVar6 * pfVar2[3] + fVar102 * pfVar3[3];
                  pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                  fVar78 = fVar104 * fVar103 + fVar109 * fVar70 + fVar112 * fVar76 + *pfVar1;
                  fVar79 = fVar104 * 0.0 + fVar109 * fVar71 + fVar112 * fVar89 + pfVar1[1];
                  fVar69 = fVar104 * 0.0 + fVar109 * 0.0 + fVar112 * fVar92 + pfVar1[2];
                  if (((fVar72 != 0.0) || (NAN(fVar72))) ||
                     ((fVar73 != 0.0 ||
                      (((NAN(fVar73) || (fStack_180 != 0.0)) || (NAN(fStack_180))))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar54 = extraout_RDX_07;
                  }
                  local_138 = (float)uVar7;
                  fStack_134 = (float)((ulong)uVar7 >> 0x20);
                  fStack_130 = (float)uVar37;
                  fVar103 = fVar103 * local_138 + fVar70 * fStack_134 + fVar76 * fStack_130;
                  fVar76 = local_138 * 0.0 + fVar71 * fStack_134 + fVar89 * fStack_130;
                  fVar101 = local_138 * 0.0 + fStack_134 * 0.0 + fVar92 * fStack_130;
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = local_188;
                  fVar92 = fStack_184;
                }
                else {
                  if (((local_218 != 0.0) || (NAN(local_218))) ||
                     ((fVar62 != 0.0 ||
                      ((NAN(fVar62) ||
                       (uVar7 = *(undefined8 *)((long)pAVar12 + lVar53 + -0x10),
                       auVar23._4_4_ = -(uint)(*(float *)((long)pAVar12 + lVar53 + -0x20) != 0.0),
                       auVar23._0_4_ = -(uint)(*(float *)((long)pAVar12 + lVar53 + -0x18) != 0.0),
                       auVar23._8_4_ = -(uint)((float)uVar7 != 0.0),
                       auVar23._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                       uVar42 = movmskps((int)CONCAT71(uVar51,bVar41),auVar23), (char)uVar42 != '\0'
                       )))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar54 = extraout_RDX_06;
                  }
                  fVar61 = pfVar1[3];
                  fVar96 = pfVar1[7];
                  fVar103 = pfVar1[8];
                  fVar76 = pfVar1[9];
                  fVar98 = pfVar1[0xb];
                  fVar78 = pfVar1[0xc];
                  fVar79 = pfVar1[0xd];
                  fVar69 = pfVar1[0xe];
                  fVar60 = pfVar1[0xf];
                  uVar7 = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                  fVar81 = *(float *)((long)pAVar12 + lVar53 + -0x30) * *pfVar1;
                  local_218 = pfVar1[1] + (float)uVar7;
                  fVar62 = pfVar1[2] + (float)((ulong)uVar7 >> 0x20);
                  fVar86 = pfVar1[6] + *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 8);
                  fVar101 = pfVar1[10] * *(float *)((long)pAVar12 + lVar53 + -8);
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = pfVar1[4];
                  fVar92 = pfVar1[5] * *(float *)((long)pAVar12 + lVar53 + -0x1c);
                }
              }
            }
          }
          else {
            pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x24);
            auVar20._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar20._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar20._8_4_ = -(uint)(pfVar2[2] != 1.0);
            auVar20._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar56 = movmskps(uVar56,auVar20);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
               (((uVar56 & 4) != 0 ||
                (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                bVar52 != 0)))) goto LAB_00153ab9;
            pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x14);
            auVar21._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar21._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar21._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar21._12_4_ = -(uint)(pfVar2[3] != 1.0);
            uVar56 = movmskps(uVar56,auVar21);
            if (((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0)) ||
               (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
               bVar52 != 0)) goto LAB_00153ab9;
            pfVar2 = (float *)((long)pAVar12 + lVar53 + -4);
            auVar22._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar22._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar22._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar22._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar56 = movmskps(uVar56,auVar22);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
            goto LAB_00153ab9;
            bVar52 = ((byte)uVar56 & 8) >> 3;
            uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
            uVar54 = (ulong)uVar56;
            if ((bVar52 != 0) ||
               ((bVar9 != false &&
                ((fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc), fVar60 != 1.0
                 || (NAN(fVar60))))))) goto LAB_00153ab9;
            uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar41);
            fVar81 = *pfVar1;
            local_218 = pfVar1[1];
            fVar62 = pfVar1[2];
            fVar61 = pfVar1[3];
            fVar89 = pfVar1[4];
            fVar92 = pfVar1[5];
            fVar86 = pfVar1[6];
            fVar96 = pfVar1[7];
            fVar103 = pfVar1[8];
            fVar76 = pfVar1[9];
            fVar101 = pfVar1[10];
            fVar98 = pfVar1[0xb];
            fVar78 = pfVar1[0xc];
            fVar79 = pfVar1[0xd];
            fVar69 = pfVar1[0xe];
            fVar60 = pfVar1[0xf];
          }
LAB_001541c9:
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x30);
          *pfVar1 = fVar81;
          pfVar1[1] = local_218;
          pfVar1[2] = fVar62;
          pfVar1[3] = fVar61;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x20);
          *pfVar1 = fVar89;
          pfVar1[1] = fVar92;
          pfVar1[2] = fVar86;
          pfVar1[3] = fVar96;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x10);
          *pfVar1 = fVar103;
          pfVar1[1] = fVar76;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar98;
          pfVar1 = (float *)((long)local_1d8 + lVar53);
          *pfVar1 = fVar78;
          pfVar1[1] = fVar79;
          pfVar1[2] = fVar69;
          pfVar1[3] = fVar60;
          lVar53 = lVar53 + 0x40;
          pvVar46 = local_1d8;
        }
      }
      else {
        if (sVar11 != plVar43[0xf]) {
          prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar50,"number of transformations does not match");
          __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar60 = (spaces->time_range).lower;
        fVar62 = (spaces->time_range).upper;
        fVar61 = (float)plVar43[0xd];
        fVar96 = (float)((ulong)plVar43[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar61);
        uVar58 = -(uint)(fVar62 < fVar96);
        local_1f8._0_8_ =
             CONCAT44(~uVar58 & (uint)fVar96,~uVar56 & (uint)fVar60) |
             CONCAT44((uint)fVar62 & uVar58,(uint)fVar61 & uVar56);
        local_1d8 = (void *)0x0;
        local_1e8 = 0;
        sStack_1e0 = 0;
        if (sVar11 != 0) {
          local_1d8 = alignedMalloc(sVar11 << 6,0x10);
          uVar54 = extraout_RDX_04;
          sStack_1e0 = sVar11;
        }
        if (spaces->quaternion == false) {
          pvVar46 = (void *)(ulong)*(uint *)(plVar43 + 0x12);
        }
        else {
          pvVar46 = (void *)0x1;
        }
        lVar53 = 0x30;
        uStack_1d0 = CONCAT71(uStack_1d0._1_7_,(char)pvVar46);
        local_1e8 = sStack_1e0;
        for (uVar55 = 0; uVar38 = uStack_1d0, uVar56 = (uint)uVar54,
            uVar55 < (spaces->spaces).size_active; uVar55 = uVar55 + 1) {
          pAVar12 = (spaces->spaces).items;
          lVar13 = plVar43[0x11];
          bVar9 = spaces->quaternion;
          uVar51 = (undefined7)((ulong)pvVar46 >> 8);
          uVar47 = CONCAT71(uVar51,bVar9);
          bVar41 = *(byte *)(plVar43 + 0x12);
          uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
          uVar44 = uStack_1d0;
          fVar60 = *(float *)((long)pAVar12 + lVar53 + -0x30);
          uVar7 = *(undefined8 *)((long)pAVar12 + lVar53 + -0x2c);
          fVar62 = (float)((ulong)uVar7 >> 0x20);
          local_218 = (float)uVar7;
          uStack_1d0._1_7_ = SUB87(uVar38,1);
          if (((((fVar60 != 1.0) || (NAN(fVar60))) || (local_218 != 0.0)) ||
              ((NAN(local_218) || (fVar62 != 0.0)))) || (NAN(fVar62))) {
LAB_00154680:
            uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar53);
            fVar61 = (float)uVar7;
            fVar96 = (float)((ulong)uVar7 >> 0x20);
            iVar57 = -(uint)(fVar61 != 1.0);
            iVar59 = -(uint)(fVar96 != 0.0);
            auVar68._4_4_ = iVar59;
            auVar68._0_4_ = iVar57;
            auVar68._8_4_ = iVar59;
            auVar68._12_4_ = iVar59;
            auVar67._8_8_ = auVar68._8_8_;
            auVar67._4_4_ = iVar57;
            auVar67._0_4_ = iVar57;
            uVar56 = movmskpd(uVar56,auVar67);
            fVar60 = *(float *)(lVar13 + -0x28 + lVar53);
            if (((((uVar56 & 1) == 0) && (bVar52 = (byte)uVar56 >> 1, bVar52 == 0)) &&
                (fVar60 == 0.0)) && (!NAN(fVar60))) {
              pfVar1 = (float *)(lVar13 + -0x24 + lVar53);
              auVar34._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar34._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar34._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar34._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar34);
              if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                 (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                pfVar1 = (float *)(lVar13 + -0x14 + lVar53);
                auVar35._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar35._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar35._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar35._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar35);
                if ((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                   (((uVar56 & 4) == 0 && (bVar52 = ((byte)uVar56 & 8) >> 3, bVar52 == 0)))) {
                  pfVar1 = (float *)(lVar13 + -4 + lVar53);
                  auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar36._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar36._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar56 = movmskps(CONCAT31((int3)(uVar56 >> 8),bVar52),auVar36);
                  if ((((((bVar41 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                       ((uVar56 & 4) == 0)) &&
                      (bVar52 = ((byte)uVar56 & 8) >> 3,
                      uVar54 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0)) &&
                     ((bVar41 == 0 ||
                      ((fVar98 = *(float *)(lVar13 + 0xc + lVar53), fVar98 == 1.0 && (!NAN(fVar98)))
                      )))) {
                    uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar9);
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x30);
                    fVar81 = *pfVar1;
                    local_218 = pfVar1[1];
                    fVar62 = pfVar1[2];
                    fVar61 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x20);
                    fVar89 = *pfVar1;
                    fVar92 = pfVar1[1];
                    fVar86 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x10);
                    fVar103 = *pfVar1;
                    fVar76 = pfVar1[1];
                    fVar101 = pfVar1[2];
                    fVar98 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                    fVar78 = *pfVar1;
                    fVar79 = pfVar1[1];
                    fVar69 = pfVar1[2];
                    fVar60 = pfVar1[3];
                    goto LAB_00154da7;
                  }
                }
              }
            }
            uVar54 = uVar47 & 0xffffffff;
            bVar52 = (byte)uVar54 | bVar41;
            uVar54 = CONCAT71((int7)(uVar54 >> 8),bVar52);
            uStack_1d0 = uVar44;
            if (bVar52 == 0) {
              pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x30);
              fVar79 = *pfVar1;
              fVar69 = pfVar1[1];
              fVar104 = pfVar1[2];
              fVar109 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x20);
              fVar112 = *pfVar1;
              fVar70 = pfVar1[1];
              fVar71 = pfVar1[2];
              fVar72 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x10);
              fVar73 = *pfVar1;
              fVar74 = pfVar1[1];
              fVar75 = pfVar1[2];
              fVar110 = pfVar1[3];
              fVar81 = fVar61 * fVar79 + fVar96 * fVar112 + fVar60 * fVar73;
              local_218 = fVar61 * fVar69 + fVar96 * fVar70 + fVar60 * fVar74;
              fVar62 = fVar61 * fVar104 + fVar96 * fVar71 + fVar60 * fVar75;
              fVar61 = fVar61 * fVar109 + fVar96 * fVar72 + fVar60 * fVar110;
              fVar60 = *(float *)(lVar13 + -0x20 + lVar53);
              fVar96 = *(float *)(lVar13 + -0x1c + lVar53);
              fVar98 = *(float *)(lVar13 + -0x18 + lVar53);
              fVar78 = *(float *)(lVar13 + -0x10 + lVar53);
              fVar89 = fVar60 * fVar79 + fVar96 * fVar112 + fVar98 * fVar73;
              fVar92 = fVar60 * fVar69 + fVar96 * fVar70 + fVar98 * fVar74;
              fVar86 = fVar60 * fVar104 + fVar96 * fVar71 + fVar98 * fVar75;
              fVar96 = fVar60 * fVar109 + fVar96 * fVar72 + fVar98 * fVar110;
              fVar60 = *(float *)(lVar13 + -0xc + lVar53);
              fVar98 = *(float *)(lVar13 + -8 + lVar53);
              fVar103 = fVar78 * fVar79 + fVar60 * fVar112 + fVar98 * fVar73;
              fVar76 = fVar78 * fVar69 + fVar60 * fVar70 + fVar98 * fVar74;
              fVar101 = fVar78 * fVar104 + fVar60 * fVar71 + fVar98 * fVar75;
              fVar98 = fVar78 * fVar109 + fVar60 * fVar72 + fVar98 * fVar110;
              fVar60 = *(float *)(lVar13 + lVar53);
              fVar6 = *(float *)(lVar13 + 4 + lVar53);
              fVar102 = *(float *)(lVar13 + 8 + lVar53);
              pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
              fVar78 = fVar60 * fVar79 + fVar6 * fVar112 + fVar102 * fVar73 + *pfVar1;
              fVar79 = fVar60 * fVar69 + fVar6 * fVar70 + fVar102 * fVar74 + pfVar1[1];
              fVar69 = fVar60 * fVar104 + fVar6 * fVar71 + fVar102 * fVar75 + pfVar1[2];
              fVar60 = fVar60 * fVar109 + fVar6 * fVar72 + fVar102 * fVar110 + pfVar1[3];
            }
            else {
              uVar47 = uVar47 & 0xffffffff;
              bVar52 = (byte)uVar47 & bVar41;
              uVar54 = CONCAT71((int7)(uVar47 >> 8),bVar52);
              if (bVar52 == 1) {
                poVar45 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar45);
                fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc);
                fVar62 = *(float *)((long)pAVar12 + lVar53 + -0x24);
                fVar61 = *(float *)((long)pAVar12 + lVar53 + -0x14);
                fVar96 = *(float *)((long)pAVar12 + lVar53 + -4);
                auVar114 = *(undefined1 (*) [16])((long)pAVar12 + lVar53 + -0x30);
                pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x20);
                fVar98 = *pfVar2;
                fVar103 = pfVar2[1];
                pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x10);
                fVar76 = *pfVar1;
                fVar78 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar104 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar101 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar102 = fVar61 * fVar61 + fVar101 + -fVar96 * fVar96;
                fVar112 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar69 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar109 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar60 = fVar61 * fVar96 - fVar60 * fVar62;
                pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                fVar89 = *pfVar1;
                fVar92 = pfVar1[1];
                fVar6 = pfVar1[2];
                fVar104 = fVar104 + fVar104;
                fVar112 = fVar112 + fVar112;
                fVar81 = fVar81 + fVar81;
                fVar109 = fVar109 + fVar109;
                fVar69 = fVar69 + fVar69;
                fVar60 = fVar60 + fVar60;
                fVar62 = fVar96 * fVar96 + fVar101 + -fVar61 * fVar61;
                fVar87 = fVar86 * 1.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar90 = fVar86 * 0.0 + fVar104 * 1.0 + fVar112 * 0.0;
                fVar93 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 1.0;
                fVar95 = fVar86 * 0.0 + fVar104 * 0.0 + fVar112 * 0.0;
                fVar82 = fVar81 * 1.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar83 = fVar81 * 0.0 + fVar102 * 1.0 + fVar109 * 0.0;
                fVar84 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 1.0;
                fVar85 = fVar81 * 0.0 + fVar102 * 0.0 + fVar109 * 0.0;
                fVar102 = fVar69 * 1.0 + fVar60 * 0.0 + fVar62 * 0.0;
                fVar109 = fVar69 * 0.0 + fVar60 * 1.0 + fVar62 * 0.0;
                fVar70 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 1.0;
                fVar72 = fVar69 * 0.0 + fVar60 * 0.0 + fVar62 * 0.0;
                local_208 = auVar114._4_4_;
                fStack_204 = auVar114._8_4_;
                local_218 = auVar114._0_4_;
                fVar105 = local_218 * fVar87 + fVar82 * 0.0 + fVar102 * 0.0;
                fVar106 = local_218 * fVar90 + fVar83 * 0.0 + fVar109 * 0.0;
                fVar107 = local_218 * fVar93 + fVar84 * 0.0 + fVar70 * 0.0;
                fVar108 = local_218 * fVar95 + fVar85 * 0.0 + fVar72 * 0.0;
                fVar104 = fVar98 * fVar87 + fVar103 * fVar82 + fVar102 * 0.0;
                fVar112 = fVar98 * fVar90 + fVar103 * fVar83 + fVar109 * 0.0;
                fVar71 = fVar98 * fVar93 + fVar103 * fVar84 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar95 + fVar103 * fVar85 + fVar72 * 0.0;
                local_188 = fVar76 * fVar87 + fVar78 * fVar82 + fVar79 * fVar102;
                fStack_184 = fVar76 * fVar90 + fVar78 * fVar83 + fVar79 * fVar109;
                fStack_180 = fVar76 * fVar93 + fVar78 * fVar84 + fVar79 * fVar70;
                fStack_17c = fVar76 * fVar95 + fVar78 * fVar85 + fVar79 * fVar72;
                fVar60 = *(float *)(lVar13 + 0xc + lVar53);
                fVar62 = *(float *)(lVar13 + -0x24 + lVar53);
                fVar61 = *(float *)(lVar13 + -0x14 + lVar53);
                fVar96 = *(float *)(lVar13 + -4 + lVar53);
                fVar101 = fVar62 * fVar61 + fVar60 * fVar96;
                fVar81 = fVar62 * fVar61 - fVar60 * fVar96;
                fVar86 = fVar60 * fVar60 + fVar62 * fVar62 + -fVar61 * fVar61 + -fVar96 * fVar96;
                fVar103 = fVar60 * fVar60 - fVar62 * fVar62;
                fVar111 = fVar61 * fVar61 + fVar103 + -fVar96 * fVar96;
                fVar110 = fVar62 * fVar96 - fVar60 * fVar61;
                fVar77 = fVar60 * fVar61 + fVar62 * fVar96;
                fVar113 = fVar61 * fVar96 + fVar60 * fVar62;
                fVar69 = fVar61 * fVar96 - fVar60 * fVar62;
                pfVar3 = (float *)(lVar13 + -0x30 + lVar53);
                fVar60 = *pfVar3;
                pfVar4 = (float *)(lVar13 + -0x20 + lVar53);
                fVar62 = *pfVar4;
                fVar98 = pfVar4[1];
                fVar97 = fVar96 * fVar96 + fVar103 + -fVar61 * fVar61;
                pfVar1 = (float *)(lVar13 + -0x10 + lVar53);
                fVar61 = *pfVar1;
                fVar96 = pfVar1[1];
                fVar103 = pfVar1[2];
                fVar101 = fVar101 + fVar101;
                fVar110 = fVar110 + fVar110;
                pfVar1 = (float *)(lVar13 + lVar53);
                fVar76 = *pfVar1;
                fVar78 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar74 = fVar86 * 1.0 + fVar101 * 0.0 + fVar110 * 0.0;
                fVar75 = fVar86 * 0.0 + fVar101 * 1.0 + fVar110 * 0.0;
                fVar110 = fVar86 * 0.0 + fVar101 * 0.0 + fVar110 * 1.0;
                fVar81 = fVar81 + fVar81;
                fVar113 = fVar113 + fVar113;
                fVar77 = fVar77 + fVar77;
                fVar69 = fVar69 + fVar69;
                fVar86 = fVar81 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                fVar101 = fVar81 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                fVar81 = fVar81 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                fVar111 = fVar77 * 1.0 + fVar69 * 0.0 + fVar97 * 0.0;
                fVar113 = fVar77 * 0.0 + fVar69 * 1.0 + fVar97 * 0.0;
                fVar69 = fVar77 * 0.0 + fVar69 * 0.0 + fVar97 * 1.0;
                fVar88 = fVar60 * fVar74 + fVar86 * 0.0 + fVar111 * 0.0;
                fVar91 = fVar60 * fVar75 + fVar101 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar60 * fVar110 + fVar81 * 0.0 + fVar69 * 0.0;
                fVar77 = fVar62 * fVar74 + fVar98 * fVar86 + fVar111 * 0.0;
                fVar97 = fVar62 * fVar75 + fVar98 * fVar101 + fVar113 * 0.0;
                fVar80 = fVar62 * fVar110 + fVar98 * fVar81 + fVar69 * 0.0;
                fVar98 = fVar61 * fVar74 + fVar96 * fVar86 + fVar103 * fVar111;
                fVar99 = fVar61 * fVar75 + fVar96 * fVar101 + fVar103 * fVar113;
                fVar100 = fVar61 * fVar110 + fVar96 * fVar81 + fVar103 * fVar69;
                fVar60 = fVar76 * fVar74 + fVar78 * fVar86 + fVar79 * fVar111 + pfVar3[1] + 0.0;
                fVar74 = fVar76 * fVar75 + fVar78 * fVar101 + fVar79 * fVar113 + pfVar3[2] + 0.0;
                fVar75 = fVar76 * fVar110 + fVar78 * fVar81 + fVar79 * fVar69 + pfVar4[2] + 0.0;
                fVar81 = fVar88 * fVar105 + fVar91 * fVar104 + fVar94 * local_188;
                local_218 = fVar88 * fVar106 + fVar91 * fVar112 + fVar94 * fStack_184;
                fVar62 = fVar88 * fVar107 + fVar91 * fVar71 + fVar94 * fStack_180;
                fVar61 = fVar88 * fVar108 + fVar91 * fVar73 + fVar94 * fStack_17c;
                fVar86 = fVar77 * fVar107 + fVar97 * fVar71 + fVar80 * fStack_180;
                fVar96 = fVar77 * fVar108 + fVar97 * fVar73 + fVar80 * fStack_17c;
                fVar103 = fVar98 * fVar105 + fVar99 * fVar104 + fVar100 * local_188;
                fVar76 = fVar98 * fVar106 + fVar99 * fVar112 + fVar100 * fStack_184;
                fVar101 = fVar98 * fVar107 + fVar99 * fVar71 + fVar100 * fStack_180;
                fVar98 = fVar98 * fVar108 + fVar99 * fVar73 + fVar100 * fStack_17c;
                fVar78 = fVar60 * fVar105 + fVar74 * fVar104 + fVar75 * local_188 +
                         fVar89 * fVar87 + fVar92 * fVar82 + fVar6 * fVar102 + local_208 + 0.0;
                fVar79 = fVar60 * fVar106 + fVar74 * fVar112 + fVar75 * fStack_184 +
                         fVar89 * fVar90 + fVar92 * fVar83 + fVar6 * fVar109 + fStack_204 + 0.0;
                fVar69 = fVar60 * fVar107 + fVar74 * fVar71 + fVar75 * fStack_180 +
                         fVar89 * fVar93 + fVar92 * fVar84 + fVar6 * fVar70 + pfVar2[2] + 0.0;
                fVar60 = fVar60 * fVar108 + fVar74 * fVar73 + fVar75 * fStack_17c +
                         fVar89 * fVar95 + fVar92 * fVar85 + fVar6 * fVar72 + 0.0;
                uVar54 = extraout_RDX_08;
                fVar89 = fVar77 * fVar105 + fVar97 * fVar104 + fVar80 * local_188;
                fVar92 = fVar77 * fVar106 + fVar97 * fVar112 + fVar80 * fStack_184;
              }
              else {
                bVar41 = bVar9 ^ 1U | bVar41;
                if (bVar41 == 0) {
                  fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc);
                  fVar61 = *(float *)((long)pAVar12 + lVar53 + -0x24);
                  fVar96 = *(float *)((long)pAVar12 + lVar53 + -0x14);
                  fVar98 = *(float *)((long)pAVar12 + lVar53 + -4);
                  pfVar2 = (float *)((long)pAVar12 + lVar53 + -0x20);
                  fVar70 = *pfVar2;
                  fVar71 = pfVar2[1];
                  fVar86 = pfVar2[2];
                  pfVar3 = (float *)((long)pAVar12 + lVar53 + -0x10);
                  fVar76 = *pfVar3;
                  fVar89 = pfVar3[1];
                  fVar92 = pfVar3[2];
                  pfVar4 = (float *)((long)pAVar12 + lVar53 + -0x30);
                  fVar103 = *pfVar4;
                  pfVar1 = (float *)(lVar13 + -0x30 + lVar53);
                  fVar78 = *pfVar1;
                  fVar79 = pfVar1[1];
                  fVar69 = pfVar1[2];
                  pfVar1 = (float *)(lVar13 + -0x20 + lVar53);
                  fVar101 = *pfVar1;
                  fVar6 = pfVar1[1];
                  fVar102 = pfVar1[2];
                  puVar5 = (undefined8 *)(lVar13 + -0x10 + lVar53);
                  uVar7 = *puVar5;
                  uVar37 = puVar5[1];
                  pfVar1 = (float *)(lVar13 + lVar53);
                  fVar104 = *pfVar1;
                  fVar109 = pfVar1[1];
                  fVar112 = pfVar1[2];
                  fVar81 = fVar78 * fVar103 + fVar79 * fVar70 + fVar69 * fVar76;
                  fVar72 = fVar78 * 0.0 + fVar79 * fVar71 + fVar69 * fVar89;
                  fVar73 = fVar78 * 0.0 + fVar79 * 0.0 + fVar69 * fVar92;
                  local_188 = fVar101 * fVar103 + fVar6 * fVar70 + fVar102 * fVar76;
                  fStack_184 = fVar101 * 0.0 + fVar6 * fVar71 + fVar102 * fVar89;
                  fStack_180 = fVar101 * 0.0 + fVar6 * 0.0 + fVar102 * fVar92;
                  fStack_17c = fVar101 * pfVar4[1] + fVar6 * pfVar2[3] + fVar102 * pfVar3[3];
                  pfVar1 = (float *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                  fVar78 = fVar104 * fVar103 + fVar109 * fVar70 + fVar112 * fVar76 + *pfVar1;
                  fVar79 = fVar104 * 0.0 + fVar109 * fVar71 + fVar112 * fVar89 + pfVar1[1];
                  fVar69 = fVar104 * 0.0 + fVar109 * 0.0 + fVar112 * fVar92 + pfVar1[2];
                  if (((fVar72 != 0.0) || (NAN(fVar72))) ||
                     ((fVar73 != 0.0 ||
                      (((NAN(fVar73) || (fStack_180 != 0.0)) || (NAN(fStack_180))))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar54 = extraout_RDX_10;
                  }
                  local_138 = (float)uVar7;
                  fStack_134 = (float)((ulong)uVar7 >> 0x20);
                  fStack_130 = (float)uVar37;
                  fVar103 = fVar103 * local_138 + fVar70 * fStack_134 + fVar76 * fStack_130;
                  fVar76 = local_138 * 0.0 + fVar71 * fStack_134 + fVar89 * fStack_130;
                  fVar101 = local_138 * 0.0 + fStack_134 * 0.0 + fVar92 * fStack_130;
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = local_188;
                  fVar92 = fStack_184;
                }
                else {
                  if (((local_218 != 0.0) || (NAN(local_218))) ||
                     ((fVar62 != 0.0 ||
                      ((NAN(fVar62) ||
                       (uVar7 = *(undefined8 *)((long)pAVar12 + lVar53 + -0x10),
                       auVar27._4_4_ = -(uint)(*(float *)((long)pAVar12 + lVar53 + -0x20) != 0.0),
                       auVar27._0_4_ = -(uint)(*(float *)((long)pAVar12 + lVar53 + -0x18) != 0.0),
                       auVar27._8_4_ = -(uint)((float)uVar7 != 0.0),
                       auVar27._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                       uVar42 = movmskps((int)CONCAT71(uVar51,bVar41),auVar27), (char)uVar42 != '\0'
                       )))))) {
                    poVar45 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar45);
                    uVar54 = extraout_RDX_09;
                  }
                  pfVar2 = (float *)(lVar13 + -0x30 + lVar53);
                  fVar61 = pfVar2[3];
                  pfVar3 = (float *)(lVar13 + -0x20 + lVar53);
                  fVar96 = pfVar3[3];
                  pfVar4 = (float *)(lVar13 + -0x10 + lVar53);
                  fVar103 = *pfVar4;
                  fVar76 = pfVar4[1];
                  fVar98 = pfVar4[3];
                  pfVar1 = (float *)(lVar13 + lVar53);
                  fVar78 = *pfVar1;
                  fVar79 = pfVar1[1];
                  fVar69 = pfVar1[2];
                  fVar60 = pfVar1[3];
                  uVar7 = *(undefined8 *)((long)&(pAVar12->l).vx.field_0 + lVar53);
                  fVar81 = *(float *)((long)pAVar12 + lVar53 + -0x30) * *pfVar2;
                  local_218 = pfVar2[1] + (float)uVar7;
                  fVar62 = pfVar2[2] + (float)((ulong)uVar7 >> 0x20);
                  fVar86 = pfVar3[2] + *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 8);
                  fVar101 = pfVar4[2] * *(float *)((long)pAVar12 + lVar53 + -8);
                  uStack_1d0 = CONCAT71(uStack_1d0._1_7_,1);
                  fVar89 = *pfVar3;
                  fVar92 = pfVar3[1] * *(float *)((long)pAVar12 + lVar53 + -0x1c);
                }
              }
            }
          }
          else {
            pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x24);
            auVar24._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar24._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar24._8_4_ = -(uint)(pfVar1[2] != 1.0);
            auVar24._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar56 = movmskps(uVar56,auVar24);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
               (((uVar56 & 4) != 0 ||
                (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                bVar52 != 0)))) goto LAB_00154680;
            pfVar1 = (float *)((long)pAVar12 + lVar53 + -0x14);
            auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar25._12_4_ = -(uint)(pfVar1[3] != 1.0);
            uVar56 = movmskps(uVar56,auVar25);
            if (((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0)) ||
               (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
               bVar52 != 0)) goto LAB_00154680;
            pfVar1 = (float *)((long)pAVar12 + lVar53 + -4);
            auVar26._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar26._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar26._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar26._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar56 = movmskps(uVar56,auVar26);
            if ((((bVar9 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
            goto LAB_00154680;
            bVar52 = ((byte)uVar56 & 8) >> 3;
            uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
            uVar54 = (ulong)uVar56;
            if ((bVar52 != 0) ||
               ((bVar9 != false &&
                ((fVar60 = *(float *)((long)&(pAVar12->l).vx.field_0 + lVar53 + 0xc), fVar60 != 1.0
                 || (NAN(fVar60))))))) goto LAB_00154680;
            uStack_1d0 = CONCAT71(uStack_1d0._1_7_,bVar41);
            pfVar1 = (float *)(lVar13 + -0x30 + lVar53);
            fVar81 = *pfVar1;
            local_218 = pfVar1[1];
            fVar62 = pfVar1[2];
            fVar61 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x20 + lVar53);
            fVar89 = *pfVar1;
            fVar92 = pfVar1[1];
            fVar86 = pfVar1[2];
            fVar96 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x10 + lVar53);
            fVar103 = *pfVar1;
            fVar76 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar98 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + lVar53);
            fVar78 = *pfVar1;
            fVar79 = pfVar1[1];
            fVar69 = pfVar1[2];
            fVar60 = pfVar1[3];
          }
LAB_00154da7:
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x30);
          *pfVar1 = fVar81;
          pfVar1[1] = local_218;
          pfVar1[2] = fVar62;
          pfVar1[3] = fVar61;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x20);
          *pfVar1 = fVar89;
          pfVar1[1] = fVar92;
          pfVar1[2] = fVar86;
          pfVar1[3] = fVar96;
          pfVar1 = (float *)((long)local_1d8 + lVar53 + -0x10);
          *pfVar1 = fVar103;
          pfVar1[1] = fVar76;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar98;
          pfVar1 = (float *)((long)local_1d8 + lVar53);
          *pfVar1 = fVar78;
          pfVar1[1] = fVar79;
          pfVar1[2] = fVar69;
          pfVar1[3] = fVar60;
          lVar53 = lVar53 + 0x40;
          pvVar46 = local_1d8;
        }
      }
      convertLightsAndCameras
                (this,group,(Ref<embree::SceneGraph::Node> *)(plVar43 + 0x13),
                 (Transformations *)&local_1f8.field_1);
      SceneGraph::Transformations::~Transformations((Transformations *)&local_1f8.field_1);
      (**(code **)(*plVar43 + 0x18))(plVar43);
    }
  }
  return;
}

Assistant:

void convertLightsAndCameras(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (!node->hasLightOrCamera) return;
      
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertLightsAndCameras(group,xfmNode->child, spaces*xfmNode->spaces);
      } 
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertLightsAndCameras(group,child,spaces);
      }
      else if (Ref<SceneGraph::AnimatedLightNode> lightNode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) {
        if (spaces.size() != 1) throw std::runtime_error("animated lights cannot get instantiated with a transform animation");
        group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
      }
      else if (Ref<SceneGraph::LightNode> lightNode = node.dynamicCast<SceneGraph::LightNode>())
      {
        if (spaces.size() == 1)
          group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
        else
        {
          std::vector<Ref<SceneGraph::LightNode>> lights(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            lights[i] = lightNode->transform(spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedLightNode(std::move(lights),spaces.time_range));
        }
      }
      else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>())
      {
        if (spaces.size() != 1) throw std::runtime_error("animated cameras cannot get instantiated with a transform animation");
        group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
      }
      else if (Ref<SceneGraph::PerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>())
      {
        if (spaces.size() == 1)
          group.push_back(new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
        else
        {
          std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            cameras[i] = new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),spaces.time_range,makeUniqueID(cameraNode->name)));
        }
      }
    }